

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

double anon_unknown.dwarf_8df1c::ParseDouble(ExpressionContext *ctx,char *str)

{
  int iVar1;
  double dVar2;
  double local_40;
  double power;
  double fractional;
  double integer;
  char *pcStack_20;
  uint digit;
  char *str_local;
  ExpressionContext *ctx_local;
  
  fractional = 0.0;
  for (pcStack_20 = str; (int)*pcStack_20 - 0x30U < 10; pcStack_20 = pcStack_20 + 1) {
    fractional = fractional * 10.0 + (double)((int)*pcStack_20 - 0x30U);
  }
  power = 0.0;
  if (*pcStack_20 == '.') {
    local_40 = 0.1;
    while( true ) {
      pcStack_20 = pcStack_20 + 1;
      if (9 < (int)*pcStack_20 - 0x30U) break;
      power = local_40 * (double)((int)*pcStack_20 - 0x30U) + power;
      local_40 = local_40 / 10.0;
    }
  }
  if (*pcStack_20 == 'e') {
    if (pcStack_20[1] == '-') {
      iVar1 = ParseInteger(ctx,pcStack_20 + 2);
      dVar2 = pow(10.0,(double)-iVar1);
      ctx_local = (ExpressionContext *)((fractional + power) * dVar2);
    }
    else {
      iVar1 = ParseInteger(ctx,pcStack_20 + 1);
      dVar2 = pow(10.0,(double)iVar1);
      ctx_local = (ExpressionContext *)((fractional + power) * dVar2);
    }
  }
  else {
    ctx_local = (ExpressionContext *)(fractional + power);
  }
  return (double)ctx_local;
}

Assistant:

double ParseDouble(ExpressionContext &ctx, const char *str)
	{
		unsigned digit;
		double integer = 0.0;

		while((digit = *str - '0') < 10)
		{
			integer = integer * 10.0 + digit;
			str++;
		}

		double fractional = 0.0;
	
		if(*str == '.')
		{
			double power = 0.1;
			str++;

			while((digit = *str - '0') < 10)
			{
				fractional = fractional + power * digit;
				power /= 10.0;
				str++;
			}
		}

		if(*str == 'e')
		{
			str++;

			if(*str == '-')
				return (integer + fractional) * pow(10.0, (double)-ParseInteger(ctx, str + 1));
			else
				return (integer + fractional) * pow(10.0, (double)ParseInteger(ctx, str));
		}

		return integer + fractional;
	}